

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_element<0>(xml_document<char> *this,char **text)

{
  byte *pbVar1;
  char cVar2;
  long lVar3;
  xml_node<char> *node;
  char *pcVar4;
  parse_error *this_00;
  size_t sVar5;
  char *pcVar6;
  pointer_____offset_0x10___ *ppuVar7;
  
  node = memory_pool<char>::allocate_node
                   (&this->super_memory_pool<char>,node_element,(char *)0x0,(char *)0x0,0,0);
  pcVar4 = *text;
  sVar5 = 0xffffffffffffffff;
  do {
    lVar3 = sVar5 + 1;
    sVar5 = sVar5 + 1;
  } while (internal::lookup_tables<0>::lookup_element_name[(byte)pcVar4[lVar3]] != '\0');
  *text = pcVar4 + sVar5;
  if (sVar5 == 0) {
    cVar2 = *pcVar4;
    this_00 = (parse_error *)__cxa_allocate_exception(0x18);
    if (cVar2 != '\0') {
      parse_error::parse_error(this_00,"expected element name or prefix",*text);
LAB_001226a2:
      ppuVar7 = &parse_error::typeinfo;
      goto LAB_001226a9;
    }
    eof_error::eof_error((eof_error *)this_00,"expected element name or prefix",*text);
  }
  else {
    if (pcVar4[sVar5] == ':') {
      node->m_prefix = pcVar4;
      node->m_prefix_size = sVar5;
      pcVar6 = *text;
      pcVar4 = pcVar6 + 1;
      *text = pcVar4;
      sVar5 = 0xffffffffffffffff;
      do {
        pbVar1 = (byte *)(pcVar6 + 1);
        pcVar6 = pcVar6 + 1;
        sVar5 = sVar5 + 1;
      } while (internal::lookup_tables<0>::lookup_node_name[*pbVar1] != '\0');
      *text = pcVar6;
      if (sVar5 == 0) {
        cVar2 = *pcVar6;
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        if (cVar2 != '\0') {
          parse_error::parse_error(this_00,"expected element local name",*text);
          goto LAB_001226a2;
        }
        eof_error::eof_error((eof_error *)this_00,"expected element local name",*text);
        goto LAB_0012266e;
      }
    }
    (node->super_xml_base<char>).m_name = pcVar4;
    (node->super_xml_base<char>).m_name_size = sVar5;
    pcVar4 = *text + -1;
    do {
      pbVar1 = (byte *)(pcVar4 + 1);
      pcVar4 = pcVar4 + 1;
    } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar1] != '\0');
    *text = pcVar4;
    parse_node_attributes<0>(this,text,node);
    pcVar4 = *text;
    cVar2 = *pcVar4;
    if (cVar2 == '/') {
      *text = pcVar4 + 1;
      if (pcVar4[1] == '>') {
        *text = pcVar4 + 2;
        goto LAB_00122574;
      }
      if (pcVar4[1] != '\0') {
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this_00,"expected >",*text);
        goto LAB_001226a2;
      }
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      eof_error::eof_error((eof_error *)this_00,"expected >",*text);
    }
    else {
      if (cVar2 == '>') {
        pcVar4 = pcVar4 + 1;
        *text = pcVar4;
        pcVar6 = parse_node_contents<0>(this,text,node);
        if ((long)pcVar6 - (long)pcVar4 != 0) {
          node->m_contents = pcVar4;
          node->m_contents_size = (long)pcVar6 - (long)pcVar4;
        }
LAB_00122574:
        pcVar4 = (node->super_xml_base<char>).m_name;
        pcVar6 = pcVar4;
        if (pcVar4 != (char *)0x0) {
          pcVar6 = (char *)(node->super_xml_base<char>).m_name_size;
        }
        pcVar4[(long)pcVar6] = '\0';
        if (node->m_prefix != (char *)0x0) {
          node->m_prefix[node->m_prefix_size] = '\0';
        }
        return node;
      }
      if (cVar2 != '\0') {
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this_00,"expected >",*text);
        goto LAB_001226a2;
      }
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      eof_error::eof_error((eof_error *)this_00,"expected >",*text);
    }
  }
LAB_0012266e:
  ppuVar7 = &eof_error::typeinfo;
LAB_001226a9:
  __cxa_throw(this_00,ppuVar7,std::runtime_error::~runtime_error);
}

Assistant:

xml_node<Ch> *parse_element(Ch *&text)
        {
            // Create element node
            xml_node<Ch> *element = this->allocate_node(node_element);

            // Extract element name
            Ch *prefix = text;
            skip<element_name_pred, Flags>(text);
            if (text == prefix)
                RAPIDXML_PARSE_ERROR("expected element name or prefix", text);
            if (*text == Ch(':')) {
                element->prefix(prefix, text - prefix);
                ++text;
                Ch *name = text;
                skip<node_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected element local name", text);
                element->name(name, text - name);
            } else {
                element->name(prefix, text - prefix);
            }

            // Skip whitespace between element name and attributes or >
            skip<whitespace_pred, Flags>(text);

            // Parse attributes, if any
            parse_node_attributes<Flags>(text, element);

            // Determine ending type
            if (*text == Ch('>'))
            {
                Ch const * contents = ++text;
                Ch const * contents_end = 0;
                if (!(Flags & parse_open_only))
                    contents_end = parse_node_contents<Flags>(text, element);
                std::size_t sz = contents_end - contents;
                if (sz) element->contents(contents, sz);
            }
            else if (*text == Ch('/'))
            {
                ++text;
                if (*text != Ch('>'))
                    RAPIDXML_PARSE_ERROR("expected >", text);
                ++text;
                if (Flags & parse_open_only)
                    RAPIDXML_PARSE_ERROR("open_only, but closed", text);
            }
            else
                RAPIDXML_PARSE_ERROR("expected >", text);

            // Place zero terminator after name
            if (!(Flags & parse_no_string_terminators)) {
                element->name()[element->name_size()] = Ch('\0');
                if (element->prefix()) element->prefix()[element->prefix_size()] = Ch('\0');
            }

            // Return parsed element
            return element;
        }